

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc_map.h
# Opt level: O0

reg_alloc_data * __thiscall
skiwi::make_reg_alloc_data
          (reg_alloc_data *__return_storage_ptr__,skiwi *this,e_register_type t,uint64_t val,
          liveness_range lr)

{
  uint64_t val_local;
  e_register_type t_local;
  liveness_range lr_local;
  
  __return_storage_ptr__->type = (e_register_type)this;
  if ((e_register_type)this == t_local) {
    __return_storage_ptr__->local_id = t;
  }
  else {
    __return_storage_ptr__->reg = t;
  }
  (__return_storage_ptr__->live_range).first = val;
  (__return_storage_ptr__->live_range).last = lr.first;
  return __return_storage_ptr__;
}

Assistant:

inline reg_alloc_data make_reg_alloc_data(reg_alloc_data::e_register_type t, uint64_t val, liveness_range lr)
  {
  reg_alloc_data rad;
  rad.type = t;
  if (t == reg_alloc_data::t_local)
    rad.local_id = (uint32_t)val;
  else
    rad.reg = (ASM::asmcode::operand)val;
  rad.live_range = lr;
  return rad;
  }